

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

NAMED * hashTableIterNext(HASH_TABLE_ITER *iter)

{
  NAMED **ppNVar1;
  NAMED *pNVar2;
  NAMED *tem;
  HASH_TABLE_ITER *iter_local;
  
  do {
    if (iter->p == iter->end) {
      return (NAMED *)0x0;
    }
    ppNVar1 = iter->p;
    iter->p = ppNVar1 + 1;
    pNVar2 = *ppNVar1;
  } while (pNVar2 == (NAMED *)0x0);
  return pNVar2;
}

Assistant:

static NAMED *FASTCALL
hashTableIterNext(HASH_TABLE_ITER *iter) {
  while (iter->p != iter->end) {
    NAMED *tem = *(iter->p)++;
    if (tem)
      return tem;
  }
  return NULL;
}